

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  pointer pTVar1;
  uint64_t *puVar2;
  pointer pTVar3;
  Result RVar4;
  char *pcVar5;
  int __c;
  Var *__s;
  Type local_98;
  uint64_t uStack_90;
  uint64_t local_88;
  undefined8 uStack_80;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar4 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar4.enum_ == Ok) {
      pcVar5 = Var::index(var,(char *)__s,__c);
      pTVar3 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pTVar1 = pTVar3 + ((ulong)pcVar5 & 0xffffffff);
      local_98 = pTVar1->element;
      uStack_90 = (pTVar1->limits).initial;
      puVar2 = &pTVar3[(ulong)pcVar5 & 0xffffffff].limits.max;
      local_88 = *puVar2;
      uStack_80 = puVar2[1];
    }
    else {
      local_88 = 0;
      uStack_80 = 0;
      local_98.enum_ = Any;
      local_98.type_index_ = 0;
      uStack_90 = 0;
    }
    (out->limits).max = local_88;
    (out->limits).has_max = (bool)(undefined1)uStack_80;
    (out->limits).is_shared = (bool)uStack_80._1_1_;
    (out->limits).is_64 = (bool)uStack_80._2_1_;
    *(undefined5 *)&(out->limits).field_0x13 = uStack_80._3_5_;
    out->element = local_98;
    (out->limits).initial = uStack_90;
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}